

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SplitLargeMeshes.cpp
# Opt level: O3

void __thiscall
Assimp::SplitLargeMeshesProcess_Triangle::SplitMesh
          (SplitLargeMeshesProcess_Triangle *this,uint a,aiMesh *pMesh,
          vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
          *avList)

{
  aiColor4D *paVar1;
  size_t __n;
  pointer *pppVar2;
  aiBone *paVar3;
  aiVertexWeight aVar4;
  uint *puVar5;
  aiVector3D *paVar6;
  iterator iVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  pointer __src;
  uint uVar23;
  Logger *this_00;
  aiMesh *paVar24;
  ulong *puVar25;
  aiFace *paVar26;
  aiVector3D *paVar27;
  void *__s;
  aiColor4D *paVar28;
  aiBone **ppaVar29;
  aiBone *paVar30;
  aiVertexWeight *paVar31;
  uint *puVar32;
  uint uVar33;
  aiFace *paVar34;
  ulong uVar35;
  ulong uVar36;
  uint uVar37;
  uint uVar38;
  ulong uVar39;
  uint uVar40;
  long lVar41;
  vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> avTempWeights;
  vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> local_4b8;
  char *local_498;
  uint local_48c;
  ulong local_488;
  ulong local_480;
  ulong local_478;
  int local_470;
  uint local_46c;
  ulong local_468;
  ulong local_460;
  aiVector3D **local_458;
  char *local_450;
  vector<std::pair<aiMesh*,unsigned_int>,std::allocator<std::pair<aiMesh*,unsigned_int>>> *local_448
  ;
  aiBone ***local_440;
  pair<aiMesh_*,_unsigned_int> local_438 [64];
  
  if (this->LIMIT < pMesh->mNumFaces) {
    this_00 = DefaultLogger::get();
    Logger::info(this_00,"Mesh exceeds the triangle limit. It will be split ...");
    local_460 = (ulong)pMesh->mNumFaces / (ulong)this->LIMIT;
    local_48c = (int)local_460 + 1;
    uVar23 = pMesh->mNumFaces / local_48c;
    local_450 = (pMesh->mName).data;
    local_470 = uVar23 * local_48c;
    local_488 = 0;
    uVar37 = 0;
    local_46c = a;
    local_448 = (vector<std::pair<aiMesh*,unsigned_int>,std::allocator<std::pair<aiMesh*,unsigned_int>>>
                 *)avList;
    do {
      paVar24 = (aiMesh *)operator_new(0x520);
      paVar24->mPrimitiveTypes = 0;
      paVar24->mNumVertices = 0;
      local_458 = &paVar24->mVertices;
      memset(local_458,0,0xcc);
      paVar24->mBones = (aiBone **)0x0;
      paVar24->mMaterialIndex = 0;
      (paVar24->mName).length = 0;
      (paVar24->mName).data[0] = '\0';
      memset((paVar24->mName).data + 1,0x1b,0x3ff);
      paVar24->mNumAnimMeshes = 0;
      paVar24->mAnimMeshes = (aiAnimMesh **)0x0;
      paVar24->mMethod = 0;
      (paVar24->mAABB).mMin.x = 0.0;
      (paVar24->mAABB).mMin.y = 0.0;
      (paVar24->mAABB).mMin.z = 0.0;
      (paVar24->mAABB).mMax.x = 0.0;
      (paVar24->mAABB).mMax.y = 0.0;
      (paVar24->mAABB).mMax.z = 0.0;
      memset(paVar24->mColors,0,0xa0);
      paVar24->mNumFaces = uVar23;
      paVar24->mMaterialIndex = pMesh->mMaterialIndex;
      if (paVar24 != pMesh) {
        uVar38 = (pMesh->mName).length;
        (paVar24->mName).length = uVar38;
        memcpy((paVar24->mName).data,local_450,(ulong)uVar38);
        (paVar24->mName).data[uVar38] = '\0';
      }
      uVar38 = uVar23;
      if (uVar37 == (uint)local_460) {
        uVar38 = (pMesh->mNumFaces - local_470) + uVar23;
        paVar24->mNumFaces = uVar38;
      }
      uVar39 = (ulong)uVar38;
      puVar25 = (ulong *)operator_new__(uVar39 * 0x10 + 8);
      *puVar25 = uVar39;
      paVar26 = (aiFace *)(puVar25 + 1);
      if (uVar38 != 0) {
        paVar34 = paVar26;
        do {
          paVar34->mNumIndices = 0;
          paVar34->mIndices = (uint *)0x0;
          paVar34 = paVar34 + 1;
        } while (paVar34 != paVar26 + uVar39);
      }
      paVar24->mFaces = paVar26;
      uVar33 = uVar37 * uVar23;
      local_478 = (ulong)uVar33;
      uVar40 = 0;
      if (uVar33 < uVar33 + uVar38) {
        uVar35 = local_488 & 0xffffffff;
        uVar40 = 0;
        do {
          uVar40 = uVar40 + pMesh->mFaces[uVar35].mNumIndices;
          uVar35 = uVar35 + 1;
        } while ((int)uVar35 != (int)local_488 + uVar38);
      }
      paVar24->mNumVertices = uVar40;
      local_498 = (char *)(ulong)uVar40;
      local_468 = uVar39;
      if (pMesh->mVertices != (aiVector3D *)0x0) {
        uVar39 = (long)local_498 * 0xc;
        paVar27 = (aiVector3D *)operator_new__(uVar39);
        if (uVar40 != 0) {
          memset(paVar27,0,((uVar39 - 0xc) / 0xc) * 0xc + 0xc);
        }
        *local_458 = paVar27;
      }
      uVar38 = pMesh->mNumVertices;
      if (uVar38 != 0 && pMesh->mNormals != (aiVector3D *)0x0) {
        uVar39 = (long)local_498 * 0xc;
        paVar27 = (aiVector3D *)operator_new__(uVar39);
        if (uVar40 != 0) {
          memset(paVar27,0,((uVar39 - 0xc) / 0xc) * 0xc + 0xc);
        }
        paVar24->mNormals = paVar27;
      }
      uVar39 = (long)local_498 * 0xc;
      if ((pMesh->mBitangents != (aiVector3D *)0x0 && pMesh->mTangents != (aiVector3D *)0x0) &&
          uVar38 != 0) {
        paVar27 = (aiVector3D *)operator_new__(uVar39);
        if (uVar40 == 0) {
          paVar24->mTangents = paVar27;
          paVar27 = (aiVector3D *)operator_new__(uVar39);
        }
        else {
          __n = ((uVar39 - 0xc) / 0xc) * 0xc + 0xc;
          memset(paVar27,0,__n);
          paVar24->mTangents = paVar27;
          paVar27 = (aiVector3D *)operator_new__(uVar39);
          memset(paVar27,0,__n);
        }
        paVar24->mBitangents = paVar27;
      }
      local_440 = &paVar24->mBones;
      local_480 = ((uVar39 - 0xc) / 0xc) * 0xc + 0xc;
      lVar41 = 0;
      do {
        *(undefined4 *)((long)paVar24->mNumUVComponents + lVar41) =
             *(undefined4 *)((long)pMesh->mNumUVComponents + lVar41);
        if (*(long *)((long)pMesh->mTextureCoords + lVar41 * 2) != 0 && uVar38 != 0) {
          __s = operator_new__(uVar39);
          if (uVar40 != 0) {
            memset(__s,0,local_480);
          }
          *(void **)((long)paVar24->mTextureCoords + lVar41 * 2) = __s;
        }
        lVar41 = lVar41 + 4;
      } while (lVar41 != 0x20);
      uVar39 = (long)local_498 << 4;
      lVar41 = 6;
      do {
        if (pMesh->mColors[lVar41 + -6] != (aiColor4D *)0x0 && uVar38 != 0) {
          paVar28 = (aiColor4D *)operator_new__(uVar39);
          if (uVar40 != 0) {
            memset(paVar28,0,uVar39);
          }
          paVar24->mColors[lVar41 + -6] = paVar28;
        }
        lVar41 = lVar41 + 1;
      } while (lVar41 != 0xe);
      uVar38 = (uint)local_468;
      if (pMesh->mBones != (aiBone **)0x0 && pMesh->mNumBones != 0) {
        ppaVar29 = (aiBone **)operator_new__((ulong)pMesh->mNumBones << 3);
        paVar24->mBones = ppaVar29;
        local_4b8.super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>._M_impl.
        super__Vector_impl_data._M_start = (aiVertexWeight *)0x0;
        local_4b8.super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>._M_impl.
        super__Vector_impl_data._M_finish = (aiVertexWeight *)0x0;
        local_4b8.super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (aiVertexWeight *)0x0;
        if (paVar24->mNumBones != 0) {
          uVar39 = 0;
          do {
            paVar3 = (*local_440)[uVar39];
            if (local_4b8.super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>.
                _M_impl.super__Vector_impl_data._M_finish !=
                local_4b8.super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>.
                _M_impl.super__Vector_impl_data._M_start) {
              local_4b8.super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_4b8.super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>.
                   _M_impl.super__Vector_impl_data._M_start;
            }
            std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::reserve
                      (&local_4b8,(ulong)paVar3->mNumWeights / (ulong)local_48c);
            uVar38 = paVar3->mNumWeights;
            local_480 = uVar39;
            if (uVar38 != 0) {
              lVar41 = 0;
              uVar39 = 0;
              do {
                uVar33 = *(uint *)((long)&paVar3->mWeights->mVertexId + lVar41);
                if (((uint)local_478 <= uVar33) && (uVar33 < (uVar37 + 3) * uVar23)) {
                  paVar31 = (aiVertexWeight *)((long)&paVar3->mWeights->mVertexId + lVar41);
                  if (local_4b8.super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>.
                      _M_impl.super__Vector_impl_data._M_finish ==
                      local_4b8.super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<aiVertexWeight,std::allocator<aiVertexWeight>>::
                    _M_realloc_insert<aiVertexWeight_const&>
                              ((vector<aiVertexWeight,std::allocator<aiVertexWeight>> *)&local_4b8,
                               (iterator)
                               local_4b8.
                               super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>.
                               _M_impl.super__Vector_impl_data._M_finish,paVar31);
                  }
                  else {
                    *local_4b8.super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>.
                     _M_impl.super__Vector_impl_data._M_finish = *paVar31;
                    local_4b8.super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>.
                    _M_impl.super__Vector_impl_data._M_finish =
                         local_4b8.
                         super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>._M_impl
                         .super__Vector_impl_data._M_finish + 1;
                  }
                  aVar4 = local_4b8.
                          super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>.
                          _M_impl.super__Vector_impl_data._M_finish[-1];
                  *paVar31 = aVar4;
                  paVar31->mVertexId = aVar4.mVertexId - (uint)local_478;
                  uVar38 = paVar3->mNumWeights;
                }
                uVar39 = uVar39 + 1;
                lVar41 = lVar41 + 8;
              } while (uVar39 < uVar38);
            }
            if (local_4b8.super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>.
                _M_impl.super__Vector_impl_data._M_start !=
                local_4b8.super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
              paVar30 = (aiBone *)operator_new(0x460);
              (paVar30->mName).length = 0;
              local_498 = (paVar30->mName).data;
              (paVar30->mName).data[0] = '\0';
              memset((paVar30->mName).data + 1,0x1b,0x3ff);
              paVar30->mNumWeights = 0;
              paVar30->mWeights = (aiVertexWeight *)0x0;
              (paVar30->mOffsetMatrix).a1 = 1.0;
              (paVar30->mOffsetMatrix).a2 = 0.0;
              (paVar30->mOffsetMatrix).a3 = 0.0;
              (paVar30->mOffsetMatrix).a4 = 0.0;
              (paVar30->mOffsetMatrix).b1 = 0.0;
              (paVar30->mOffsetMatrix).b2 = 1.0;
              (paVar30->mOffsetMatrix).b3 = 0.0;
              (paVar30->mOffsetMatrix).b4 = 0.0;
              (paVar30->mOffsetMatrix).c1 = 0.0;
              (paVar30->mOffsetMatrix).c2 = 0.0;
              (paVar30->mOffsetMatrix).c3 = 1.0;
              (paVar30->mOffsetMatrix).c4 = 0.0;
              (paVar30->mOffsetMatrix).d1 = 0.0;
              (paVar30->mOffsetMatrix).d2 = 0.0;
              (paVar30->mOffsetMatrix).d3 = 0.0;
              (paVar30->mOffsetMatrix).d4 = 1.0;
              uVar38 = paVar24->mNumBones;
              paVar24->mNumBones = uVar38 + 1;
              paVar24->mBones[uVar38] = paVar30;
              uVar38 = (paVar3->mName).length;
              if (0x3fe < uVar38) {
                uVar38 = 0x3ff;
              }
              uVar39 = (ulong)uVar38;
              local_438[0].first = (aiMesh *)CONCAT44(local_438[0].first._4_4_,uVar38);
              memcpy((void *)((long)&local_438[0].first + 4),(paVar3->mName).data,uVar39);
              *(undefined1 *)((long)&local_438[0].first + uVar39 + 4) = 0;
              (paVar30->mName).length = uVar38;
              memcpy(local_498,(void *)((long)&local_438[0].first + 4),uVar39);
              __src = local_4b8.super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>.
                      _M_impl.super__Vector_impl_data._M_start;
              (paVar30->mName).data[uVar39] = '\0';
              uVar39 = (ulong)((long)local_4b8.
                                     super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_4b8.
                                    super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3;
              paVar30->mNumWeights = (uint)uVar39;
              fVar8 = (paVar3->mOffsetMatrix).a2;
              fVar9 = (paVar3->mOffsetMatrix).a3;
              fVar10 = (paVar3->mOffsetMatrix).a4;
              fVar11 = (paVar3->mOffsetMatrix).b1;
              fVar12 = (paVar3->mOffsetMatrix).b2;
              fVar13 = (paVar3->mOffsetMatrix).b3;
              fVar14 = (paVar3->mOffsetMatrix).b4;
              fVar15 = (paVar3->mOffsetMatrix).c1;
              fVar16 = (paVar3->mOffsetMatrix).c2;
              fVar17 = (paVar3->mOffsetMatrix).c3;
              fVar18 = (paVar3->mOffsetMatrix).c4;
              fVar19 = (paVar3->mOffsetMatrix).d1;
              fVar20 = (paVar3->mOffsetMatrix).d2;
              fVar21 = (paVar3->mOffsetMatrix).d3;
              fVar22 = (paVar3->mOffsetMatrix).d4;
              (paVar30->mOffsetMatrix).a1 = (paVar3->mOffsetMatrix).a1;
              (paVar30->mOffsetMatrix).a2 = fVar8;
              (paVar30->mOffsetMatrix).a3 = fVar9;
              (paVar30->mOffsetMatrix).a4 = fVar10;
              (paVar30->mOffsetMatrix).b1 = fVar11;
              (paVar30->mOffsetMatrix).b2 = fVar12;
              (paVar30->mOffsetMatrix).b3 = fVar13;
              (paVar30->mOffsetMatrix).b4 = fVar14;
              (paVar30->mOffsetMatrix).c1 = fVar15;
              (paVar30->mOffsetMatrix).c2 = fVar16;
              (paVar30->mOffsetMatrix).c3 = fVar17;
              (paVar30->mOffsetMatrix).c4 = fVar18;
              (paVar30->mOffsetMatrix).d1 = fVar19;
              (paVar30->mOffsetMatrix).d2 = fVar20;
              (paVar30->mOffsetMatrix).d3 = fVar21;
              (paVar30->mOffsetMatrix).d4 = fVar22;
              if (uVar37 == (uint)local_460) {
                paVar30->mWeights = paVar3->mWeights;
                paVar3->mWeights = (aiVertexWeight *)0x0;
                paVar31 = paVar30->mWeights;
                uVar39 = (ulong)paVar30->mNumWeights;
              }
              else {
                uVar35 = (long)local_4b8.
                               super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_4b8.
                               super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>.
                               _M_impl.super__Vector_impl_data._M_start & 0x7fffffff8;
                paVar31 = (aiVertexWeight *)operator_new__(uVar35);
                if ((uint)uVar39 != 0) {
                  memset(paVar31,0,uVar35);
                }
                paVar30->mWeights = paVar31;
              }
              memcpy(paVar31,__src,(uVar39 & 0xffffffff) << 3);
            }
            uVar39 = local_480 + 1;
          } while (uVar39 < paVar24->mNumBones);
          if (local_4b8.super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>._M_impl.
              super__Vector_impl_data._M_start != (aiVertexWeight *)0x0) {
            operator_delete(local_4b8.
                            super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_4b8.
                                  super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_4b8.
                                  super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
        }
        uVar38 = paVar24->mNumFaces;
      }
      if (uVar38 != 0) {
        uVar39 = 0;
        uVar38 = 0;
        do {
          paVar24->mFaces[uVar39].mNumIndices = 3;
          uVar40 = (int)local_478 + (int)uVar39;
          uVar33 = pMesh->mFaces[uVar40].mNumIndices;
          uVar35 = (ulong)uVar33;
          paVar24->mFaces[uVar39].mNumIndices = uVar33;
          puVar5 = pMesh->mFaces[uVar40].mIndices;
          puVar32 = (uint *)operator_new__(uVar35 * 4);
          paVar24->mFaces[uVar39].mIndices = puVar32;
          if (uVar33 - 1 < 3) {
            paVar24->mPrimitiveTypes =
                 paVar24->mPrimitiveTypes | *(uint *)(&DAT_006bab88 + (ulong)(uVar33 - 1) * 4);
LAB_003d09a0:
            uVar36 = 0;
            uVar33 = uVar38;
            do {
              uVar40 = puVar5[uVar36];
              puVar32[uVar36] = uVar33;
              paVar27 = pMesh->mVertices;
              if (paVar27 != (aiVector3D *)0x0) {
                paVar6 = *local_458;
                paVar6[uVar33].z = paVar27[uVar40].z;
                fVar8 = paVar27[uVar40].y;
                paVar6 = paVar6 + uVar33;
                paVar6->x = paVar27[uVar40].x;
                paVar6->y = fVar8;
              }
              paVar27 = pMesh->mNormals;
              if ((paVar27 != (aiVector3D *)0x0) && (pMesh->mNumVertices != 0)) {
                paVar6 = paVar24->mNormals;
                paVar6[uVar33].z = paVar27[uVar40].z;
                fVar8 = paVar27[uVar40].y;
                paVar6 = paVar6 + uVar33;
                paVar6->x = paVar27[uVar40].x;
                paVar6->y = fVar8;
              }
              paVar27 = pMesh->mTangents;
              if (((paVar27 != (aiVector3D *)0x0) && (pMesh->mBitangents != (aiVector3D *)0x0)) &&
                 (pMesh->mNumVertices != 0)) {
                paVar6 = paVar24->mTangents;
                paVar6[uVar33].z = paVar27[uVar40].z;
                fVar8 = paVar27[uVar40].y;
                paVar6 = paVar6 + uVar33;
                paVar6->x = paVar27[uVar40].x;
                paVar6->y = fVar8;
                paVar27 = pMesh->mBitangents;
                paVar6 = paVar24->mBitangents;
                paVar6[uVar33].z = paVar27[uVar40].z;
                paVar27 = paVar27 + uVar40;
                fVar8 = paVar27->y;
                paVar6 = paVar6 + uVar33;
                paVar6->x = paVar27->x;
                paVar6->y = fVar8;
              }
              uVar38 = uVar33 + 1;
              lVar41 = 0;
              do {
                paVar27 = pMesh->mTextureCoords[lVar41];
                if ((paVar27 != (aiVector3D *)0x0) && (pMesh->mNumVertices != 0)) {
                  paVar6 = paVar24->mTextureCoords[lVar41];
                  paVar6[uVar33].z = paVar27[uVar40].z;
                  fVar8 = paVar27[uVar40].y;
                  paVar6 = paVar6 + uVar33;
                  paVar6->x = paVar27[uVar40].x;
                  paVar6->y = fVar8;
                }
                lVar41 = lVar41 + 1;
              } while (lVar41 != 8);
              lVar41 = 0;
              do {
                if ((pMesh->mColors[lVar41] != (aiColor4D *)0x0) && (pMesh->mNumVertices != 0)) {
                  paVar28 = pMesh->mColors[lVar41] + uVar40;
                  fVar8 = paVar28->g;
                  fVar9 = paVar28->b;
                  fVar10 = paVar28->a;
                  paVar1 = paVar24->mColors[lVar41] + uVar33;
                  paVar1->r = paVar28->r;
                  paVar1->g = fVar8;
                  paVar1->b = fVar9;
                  paVar1->a = fVar10;
                }
                lVar41 = lVar41 + 1;
              } while (lVar41 != 8);
              uVar36 = uVar36 + 1;
              uVar33 = uVar38;
            } while (uVar36 != uVar35);
          }
          else {
            paVar24->mPrimitiveTypes = paVar24->mPrimitiveTypes | 8;
            if (uVar35 != 0) goto LAB_003d09a0;
          }
          uVar39 = uVar39 + 1;
        } while (uVar39 < paVar24->mNumFaces);
      }
      local_438[0].second = local_46c;
      iVar7._M_current = *(pair<aiMesh_*,_unsigned_int> **)(local_448 + 8);
      local_438[0].first = paVar24;
      if (iVar7._M_current == *(pair<aiMesh_*,_unsigned_int> **)(local_448 + 0x10)) {
        std::vector<std::pair<aiMesh*,unsigned_int>,std::allocator<std::pair<aiMesh*,unsigned_int>>>
        ::_M_realloc_insert<std::pair<aiMesh*,unsigned_int>>(local_448,iVar7,local_438);
      }
      else {
        (iVar7._M_current)->first = paVar24;
        *(ulong *)&(iVar7._M_current)->second = CONCAT44(local_438[0]._12_4_,local_46c);
        *(long *)(local_448 + 8) = *(long *)(local_448 + 8) + 0x10;
      }
      uVar37 = uVar37 + 1;
      local_488 = (ulong)((int)local_488 + uVar23);
    } while (uVar37 < local_48c);
    if (pMesh != (aiMesh *)0x0) {
      aiMesh::~aiMesh(pMesh);
    }
    operator_delete(pMesh,0x520);
  }
  else {
    iVar7._M_current =
         (avList->
         super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (iVar7._M_current ==
        (avList->
        super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_438[0].first = pMesh;
      local_438[0].second = a;
      std::vector<std::pair<aiMesh*,unsigned_int>,std::allocator<std::pair<aiMesh*,unsigned_int>>>::
      _M_realloc_insert<std::pair<aiMesh*,unsigned_int>>
                ((vector<std::pair<aiMesh*,unsigned_int>,std::allocator<std::pair<aiMesh*,unsigned_int>>>
                  *)avList,iVar7,local_438);
    }
    else {
      (iVar7._M_current)->first = pMesh;
      *(ulong *)&(iVar7._M_current)->second = CONCAT44(local_438[0]._12_4_,a);
      pppVar2 = &(avList->
                 super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *pppVar2 = *pppVar2 + 1;
    }
  }
  return;
}

Assistant:

void SplitLargeMeshesProcess_Triangle::SplitMesh(
        unsigned int a,
        aiMesh* pMesh,
        std::vector<std::pair<aiMesh*, unsigned int> >& avList) {
    if (pMesh->mNumFaces > SplitLargeMeshesProcess_Triangle::LIMIT) {
        ASSIMP_LOG_INFO("Mesh exceeds the triangle limit. It will be split ...");

        // we need to split this mesh into sub meshes
        // determine the size of a submesh
        const unsigned int iSubMeshes = (pMesh->mNumFaces / LIMIT) + 1;

        const unsigned int iOutFaceNum = pMesh->mNumFaces / iSubMeshes;
        const unsigned int iOutVertexNum = iOutFaceNum * 3;

        // now generate all submeshes
        for (unsigned int i = 0; i < iSubMeshes;++i) {
            aiMesh* pcMesh          = new aiMesh;
            pcMesh->mNumFaces       = iOutFaceNum;
            pcMesh->mMaterialIndex  = pMesh->mMaterialIndex;

            // the name carries the adjacency information between the meshes
            pcMesh->mName = pMesh->mName;

            if (i == iSubMeshes-1) {
                pcMesh->mNumFaces = iOutFaceNum + (
                    pMesh->mNumFaces - iOutFaceNum * iSubMeshes);
            }
            // copy the list of faces
            pcMesh->mFaces = new aiFace[pcMesh->mNumFaces];

            const unsigned int iBase = iOutFaceNum * i;

            // get the total number of indices
            unsigned int iCnt = 0;
            for (unsigned int p = iBase; p < pcMesh->mNumFaces + iBase;++p) {
                iCnt += pMesh->mFaces[p].mNumIndices;
            }
            pcMesh->mNumVertices = iCnt;

            // allocate storage
            if (pMesh->mVertices != nullptr) {
                pcMesh->mVertices = new aiVector3D[iCnt];
            }

            if (pMesh->HasNormals()) {
                pcMesh->mNormals = new aiVector3D[iCnt];
            }

            if (pMesh->HasTangentsAndBitangents()) {
                pcMesh->mTangents = new aiVector3D[iCnt];
                pcMesh->mBitangents = new aiVector3D[iCnt];
            }

            // texture coordinates
            for (unsigned int c = 0;  c < AI_MAX_NUMBER_OF_TEXTURECOORDS;++c) {
                pcMesh->mNumUVComponents[c] = pMesh->mNumUVComponents[c];
                if (pMesh->HasTextureCoords( c)) {
                    pcMesh->mTextureCoords[c] = new aiVector3D[iCnt];
                }
            }

            // vertex colors
            for (unsigned int c = 0;  c < AI_MAX_NUMBER_OF_COLOR_SETS;++c) {
                if (pMesh->HasVertexColors( c)) {
                    pcMesh->mColors[c] = new aiColor4D[iCnt];
                }
            }

            if (pMesh->HasBones()) {
                // assume the number of bones won't change in most cases
                pcMesh->mBones = new aiBone*[pMesh->mNumBones];

                // iterate through all bones of the mesh and find those which
                // need to be copied to the split mesh
                std::vector<aiVertexWeight> avTempWeights;
                for (unsigned int p = 0; p < pcMesh->mNumBones;++p) {
                    aiBone* const bone = pcMesh->mBones[p];
                    avTempWeights.clear();
                    avTempWeights.reserve(bone->mNumWeights / iSubMeshes);

                    for (unsigned int q = 0; q < bone->mNumWeights;++q) {
                        aiVertexWeight& weight = bone->mWeights[q];
                        if(weight.mVertexId >= iBase && weight.mVertexId < iBase + iOutVertexNum) {
                            avTempWeights.push_back(weight);
                            weight = avTempWeights.back();
                            weight.mVertexId -= iBase;
                        }
                    }

                    if (!avTempWeights.empty()) {
                        // we'll need this bone. Copy it ...
                        aiBone* pc = new aiBone();
                        pcMesh->mBones[pcMesh->mNumBones++] = pc;
                        pc->mName = aiString(bone->mName);
                        pc->mNumWeights = (unsigned int)avTempWeights.size();
                        pc->mOffsetMatrix = bone->mOffsetMatrix;

                        // no need to reallocate the array for the last submesh.
                        // Here we can reuse the (large) source array, although
                        // we'll waste some memory
                        if (iSubMeshes-1 == i) {
                            pc->mWeights = bone->mWeights;
                            bone->mWeights = nullptr;
                        } else {
                            pc->mWeights = new aiVertexWeight[pc->mNumWeights];
                        }

                        // copy the weights
                        ::memcpy(pc->mWeights,&avTempWeights[0],sizeof(aiVertexWeight)*pc->mNumWeights);
                    }
                }
            }

            // (we will also need to copy the array of indices)
            unsigned int iCurrent = 0;
            for (unsigned int p = 0; p < pcMesh->mNumFaces;++p) {
                pcMesh->mFaces[p].mNumIndices = 3;
                // allocate a new array
                const unsigned int iTemp = p + iBase;
                const unsigned int iNumIndices = pMesh->mFaces[iTemp].mNumIndices;

                // setup face type and number of indices
                pcMesh->mFaces[p].mNumIndices = iNumIndices;
                unsigned int* pi = pMesh->mFaces[iTemp].mIndices;
                unsigned int* piOut = pcMesh->mFaces[p].mIndices = new unsigned int[iNumIndices];

                // need to update the output primitive types
                switch (iNumIndices) {
                case 1:
                    pcMesh->mPrimitiveTypes |= aiPrimitiveType_POINT;
                    break;
                case 2:
                    pcMesh->mPrimitiveTypes |= aiPrimitiveType_LINE;
                    break;
                case 3:
                    pcMesh->mPrimitiveTypes |= aiPrimitiveType_TRIANGLE;
                    break;
                default:
                    pcMesh->mPrimitiveTypes |= aiPrimitiveType_POLYGON;
                }

                // and copy the contents of the old array, offset by current base
                for (unsigned int v = 0; v < iNumIndices;++v) {
                    unsigned int iIndex = pi[v];
                    unsigned int iIndexOut = iCurrent++;
                    piOut[v] = iIndexOut;

                    // copy positions
                    if (pMesh->mVertices != nullptr) {
                        pcMesh->mVertices[iIndexOut] = pMesh->mVertices[iIndex];
                    }

                    // copy normals
                    if (pMesh->HasNormals()) {
                        pcMesh->mNormals[iIndexOut] = pMesh->mNormals[iIndex];
                    }

                    // copy tangents/bitangents
                    if (pMesh->HasTangentsAndBitangents()) {
                        pcMesh->mTangents[iIndexOut] = pMesh->mTangents[iIndex];
                        pcMesh->mBitangents[iIndexOut] = pMesh->mBitangents[iIndex];
                    }

                    // texture coordinates
                    for (unsigned int c = 0;  c < AI_MAX_NUMBER_OF_TEXTURECOORDS;++c) {
                        if (pMesh->HasTextureCoords( c ) ) {
                            pcMesh->mTextureCoords[c][iIndexOut] = pMesh->mTextureCoords[c][iIndex];
                        }
                    }
                    // vertex colors
                    for (unsigned int c = 0;  c < AI_MAX_NUMBER_OF_COLOR_SETS;++c) {
                        if (pMesh->HasVertexColors( c)) {
                            pcMesh->mColors[c][iIndexOut] = pMesh->mColors[c][iIndex];
                        }
                    }
                }
            }

            // add the newly created mesh to the list
            avList.push_back(std::pair<aiMesh*, unsigned int>(pcMesh,a));
        }

        // now delete the old mesh data
        delete pMesh;
    } else {
        avList.push_back(std::pair<aiMesh*, unsigned int>(pMesh,a));
    }
}